

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.h
# Opt level: O0

error bop<45>(context *ctx,token *token,opcode *op)

{
  bool bVar1;
  long *plVar2;
  undefined8 in_RCX;
  optional<unsigned_long> oVar3;
  token local_80;
  string_view local_58;
  _Storage<unsigned_long,_true> local_48;
  undefined1 local_40;
  undefined1 local_38 [8];
  optional<long> value;
  opcode *op_local;
  token *token_local;
  context *ctx_local;
  
  value.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>._8_8_ =
       in_RCX;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_58,".");
  oVar3 = find_in_table((token *)op,bop<45>::table,local_58);
  local_48._M_value =
       oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  local_40 = oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long>._M_engaged;
  std::optional<long>::optional<unsigned_long,_true>
            ((optional<long> *)local_38,(optional<unsigned_long> *)&local_48);
  bVar1 = std::optional::operator_cast_to_bool((optional *)local_38);
  if (bVar1) {
    plVar2 = std::optional<long>::operator*((optional<long> *)local_38);
    opcode::add_bits((opcode *)
                     value.super__Optional_base<long,_true,_true>._M_payload.
                     super__Optional_payload_base<long>._8_8_,*plVar2 << 0x2d);
    context::tokenize(&local_80,(context *)token);
    memcpy(op,&local_80,0x24);
    memset(ctx,0,8);
    error::error((error *)ctx);
  }
  else {
    fail((token *)ctx,(char *)op,"expected .AND, .OR or .XOR");
  }
  return (unique_ptr<char[],_std::default_delete<char[]>_>)
         (unique_ptr<char[],_std::default_delete<char[]>_>)ctx;
}

Assistant:

DEFINE_OPERAND(bop)
{
    static const char* table[] = {"AND", "OR", "XOR", "INVALIDBOP3", nullptr};
    const std::optional<int64_t> value = find_in_table(token, table, ".");
    if (!value) {
        return fail(token, "expected .AND, .OR or .XOR");
    }
    op.add_bits(*value << address);
    token = ctx.tokenize();
    return {};
}